

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile_s.c
# Opt level: O0

errno_t tmpfile_s(FILE **streamptr)

{
  FILE *pFVar1;
  int *piVar2;
  FILE **streamptr_local;
  
  if (streamptr == (FILE **)0x0) {
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    streamptr_local._4_4_ = 0x16;
  }
  else {
    pFVar1 = tmpfile();
    *streamptr = (FILE *)pFVar1;
    if (*streamptr == (FILE *)0x0) {
      piVar2 = _PDCLIB_errno_func();
      if (*piVar2 == 0) {
        _PDCLIB_assert99("Assertion failed: *_PDCLIB_errno_func() != 0, function ","tmpfile_s",
                         ", file /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line 26.\n"
                        );
      }
      piVar2 = _PDCLIB_errno_func();
      streamptr_local._4_4_ = *piVar2;
    }
    else {
      streamptr_local._4_4_ = 0;
    }
  }
  return streamptr_local._4_4_;
}

Assistant:

errno_t tmpfile_s( FILE * _PDCLIB_restrict * _PDCLIB_restrict streamptr )
{
    if ( streamptr == NULL )
    {
        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    *streamptr = tmpfile();

    if ( *streamptr == NULL )
    {
        assert( *_PDCLIB_errno_func() != 0 );
        return *_PDCLIB_errno_func();
    }

    return 0;
}